

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib-flate.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ostream *poVar5;
  string *psVar6;
  ulong uVar7;
  element_type *peVar8;
  size_t sVar9;
  char *local_27d0;
  char *local_27c0;
  exception *e;
  size_t len;
  undefined1 local_2798 [7];
  bool done;
  uchar buf [10000];
  function<void_(const_char_*,_int)> local_80;
  element_type *local_60;
  undefined1 local_58 [8];
  shared_ptr<Pl_Flate> flate;
  shared_ptr<Pl_StdioFile> out;
  byte local_21;
  int local_20;
  undefined4 uStack_1c;
  bool warn;
  int level;
  action_e action;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _level = argv;
  argv_local._0_4_ = argc;
  pcVar3 = strrchr(*argv,0x2f);
  if (pcVar3 == (char *)0x0) {
    whoami = *_level;
  }
  else {
    whoami = pcVar3 + 1;
  }
  if (((int)argv_local == 2) && (iVar2 = strcmp(_level[1],"--version"), iVar2 == 0)) {
    poVar4 = std::operator<<((ostream *)&std::cout,whoami);
    poVar5 = std::operator<<(poVar4," from qpdf version ");
    psVar6 = (string *)QPDF::QPDFVersion_abi_cxx11_((QPDF *)poVar4);
    poVar4 = std::operator<<(poVar5,psVar6);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  if ((int)argv_local != 2) {
    usage();
  }
  uStack_1c = 0;
  iVar2 = strcmp(_level[1],"-uncompress");
  if (iVar2 != 0) {
    iVar2 = strcmp(_level[1],"-compress");
    if (iVar2 == 0) {
      uStack_1c = 1;
    }
    else {
      iVar2 = strncmp(_level[1],"-compress=",10);
      if (iVar2 == 0) {
        uStack_1c = 1;
        local_20 = QUtil::string_to_int(_level[1] + 10);
        Pl_Flate::setCompressionLevel(local_20);
      }
      else {
        iVar2 = strcmp(_level[1],"--_zopfli");
        if (iVar2 == 0) {
          uVar7 = Pl_Flate::zopfli_supported();
          if ((uVar7 & 1) == 0) {
            local_27c0 = "0";
          }
          else {
            local_27c0 = "1";
          }
          poVar4 = std::operator<<((ostream *)&std::cout,local_27c0);
          uVar7 = Pl_Flate::zopfli_enabled();
          if ((uVar7 & 1) == 0) {
            local_27d0 = "0";
          }
          else {
            local_27d0 = "1";
          }
          poVar4 = std::operator<<(poVar4,local_27d0);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          return 0;
        }
        usage();
      }
    }
  }
  local_21 = 0;
  QUtil::binary_stdout();
  QUtil::binary_stdin();
  Pl_Flate::zopfli_check_env((QPDFLogger *)0x0);
  std::make_shared<Pl_StdioFile,char_const(&)[7],_IO_FILE*&>
            ((char (*) [7])
             &flate.super___shared_ptr<Pl_Flate,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (_IO_FILE **)"stdout");
  local_60 = std::__shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2> *)
                        &flate.super___shared_ptr<Pl_Flate,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<Pl_Flate,char_const(&)[6],Pl_StdioFile*,Pl_Flate::action_e&>
            ((char (*) [6])local_58,(Pl_StdioFile **)"flate",(action_e *)&local_60);
  peVar8 = std::__shared_ptr_access<Pl_Flate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Pl_Flate,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_58);
  buf._9992_8_ = &local_21;
  std::function<void(char_const*,int)>::function<main::__0,void>
            ((function<void(char_const*,int)> *)&local_80,(anon_class_8_1_89933f84 *)(buf + 0x2708))
  ;
  Pl_Flate::setWarnCallback(peVar8,&local_80);
  std::function<void_(const_char_*,_int)>::~function(&local_80);
  bVar1 = false;
  while (!bVar1) {
    sVar9 = fread(local_2798,1,10000,_stdin);
    if (sVar9 == 0) {
      bVar1 = true;
    }
    else {
      peVar8 = std::__shared_ptr_access<Pl_Flate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Pl_Flate,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )local_58);
      (**(code **)(*(long *)peVar8 + 0x10))(peVar8,local_2798,sVar9);
    }
  }
  peVar8 = std::__shared_ptr_access<Pl_Flate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Pl_Flate,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_58);
  (**(code **)(*(long *)peVar8 + 0x18))();
  std::shared_ptr<Pl_Flate>::~shared_ptr((shared_ptr<Pl_Flate> *)local_58);
  std::shared_ptr<Pl_StdioFile>::~shared_ptr
            ((shared_ptr<Pl_StdioFile> *)
             &flate.super___shared_ptr<Pl_Flate,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((local_21 & 1) == 0) {
    return 0;
  }
  exit(3);
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((whoami = strrchr(argv[0], '/')) == nullptr) {
        whoami = argv[0];
    } else {
        ++whoami;
    }

    if ((argc == 2) && (strcmp(argv[1], "--version") == 0)) {
        std::cout << whoami << " from qpdf version " << QPDF::QPDFVersion() << std::endl;
        exit(0);
    }

    if (argc != 2) {
        usage();
    }

    Pl_Flate::action_e action = Pl_Flate::a_inflate;

    if ((strcmp(argv[1], "-uncompress") == 0)) {
        // okay
    } else if ((strcmp(argv[1], "-compress") == 0)) {
        action = Pl_Flate::a_deflate;
    } else if ((strncmp(argv[1], "-compress=", 10) == 0)) {
        action = Pl_Flate::a_deflate;
        int level = QUtil::string_to_int(argv[1] + 10);
        Pl_Flate::setCompressionLevel(level);
    } else if (strcmp(argv[1], "--_zopfli") == 0) {
        // Undocumented option, but that doesn't mean someone doesn't use it...
        // This is primarily here to support the test suite.
        std::cout << (Pl_Flate::zopfli_supported() ? "1" : "0")
                  << (Pl_Flate::zopfli_enabled() ? "1" : "0") << std::endl;
        return 0;
    } else {
        usage();
    }

    bool warn = false;
    try {
        QUtil::binary_stdout();
        QUtil::binary_stdin();
        Pl_Flate::zopfli_check_env();
        auto out = std::make_shared<Pl_StdioFile>("stdout", stdout);
        auto flate = std::make_shared<Pl_Flate>("flate", out.get(), action);
        flate->setWarnCallback([&warn](char const* msg, int code) {
            warn = true;
            std::cerr << whoami << ": WARNING: zlib code " << code << ", msg = " << msg
                      << std::endl;
        });

        unsigned char buf[10000];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), stdin);
            if (len <= 0) {
                done = true;
            } else {
                flate->write(buf, len);
            }
        }
        flate->finish();
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << std::endl;
        exit(2);
    }

    if (warn) {
        exit(3);
    }
    return 0;
}